

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlParserInputBufferPush(xmlParserInputBufferPtr in,int len,char *buf)

{
  int iVar1;
  xmlCharEncError xVar2;
  xmlBufPtr pxVar3;
  size_t sStack_30;
  int ret;
  size_t nbchars;
  char *buf_local;
  xmlParserInputBufferPtr pxStack_18;
  int len_local;
  xmlParserInputBufferPtr in_local;
  
  sStack_30 = 0;
  if (len < 0) {
    in_local._4_4_ = 0;
  }
  else if ((in == (xmlParserInputBufferPtr)0x0) || (in->error != 0)) {
    in_local._4_4_ = -1;
  }
  else {
    nbchars = (size_t)buf;
    buf_local._4_4_ = len;
    pxStack_18 = in;
    if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      sStack_30 = (size_t)len;
      iVar1 = xmlBufAdd(in->buffer,(xmlChar *)buf,sStack_30);
      if (iVar1 != 0) {
        pxStack_18->error = 2;
        return -1;
      }
    }
    else {
      if (in->raw == (xmlBufPtr)0x0) {
        pxVar3 = xmlBufCreate(0x32);
        pxStack_18->raw = pxVar3;
        if (pxStack_18->raw == (xmlBufPtr)0x0) {
          pxStack_18->error = 2;
          return -1;
        }
      }
      iVar1 = xmlBufAdd(pxStack_18->raw,(xmlChar *)nbchars,(long)buf_local._4_4_);
      if (iVar1 != 0) {
        pxStack_18->error = 2;
        return -1;
      }
      sStack_30 = 0xffffffffffffffff;
      xVar2 = xmlCharEncInput(pxStack_18,&stack0xffffffffffffffd0,0);
      if (xVar2 != XML_ENC_ERR_SUCCESS) {
        return -1;
      }
      if (0x7fffffff < sStack_30) {
        sStack_30 = 0x7fffffff;
      }
    }
    in_local._4_4_ = (int)sStack_30;
  }
  return in_local._4_4_;
}

Assistant:

int
xmlParserInputBufferPush(xmlParserInputBufferPtr in,
	                 int len, const char *buf) {
    size_t nbchars = 0;
    int ret;

    if (len < 0) return(0);
    if ((in == NULL) || (in->error)) return(-1);
    if (in->encoder != NULL) {
        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate(50);
            if (in->raw == NULL) {
                in->error = XML_ERR_NO_MEMORY;
                return(-1);
            }
	}
	ret = xmlBufAdd(in->raw, (const xmlChar *) buf, len);
	if (ret != 0) {
            in->error = XML_ERR_NO_MEMORY;
	    return(-1);
        }

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
        nbchars = SIZE_MAX;
	if (xmlCharEncInput(in, &nbchars, /* flush */ 0) !=
            XML_ENC_ERR_SUCCESS)
            return(-1);
        if (nbchars > INT_MAX)
            nbchars = INT_MAX;
    } else {
	nbchars = len;
        ret = xmlBufAdd(in->buffer, (xmlChar *) buf, nbchars);
	if (ret != 0) {
            in->error = XML_ERR_NO_MEMORY;
	    return(-1);
        }
    }
    return(nbchars);
}